

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O1

double duckdb::alp::AlpRDCompression<double,_true>::FindBestDictionary
                 (vector<unsigned_long,_true> *values,State *state)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = 2147483647.0;
  lVar4 = 0x10;
  uVar2 = 0;
  do {
    uVar3 = (int)lVar4 + 0x2f;
    dVar5 = BuildLeftPartsDictionary<false>(values,(uint8_t)uVar3,state);
    bVar1 = dVar5 <= dVar6;
    dVar6 = (double)(-(ulong)(dVar6 < dVar5) & (ulong)dVar6 |
                    ~-(ulong)(dVar6 < dVar5) & (ulong)dVar5);
    uVar2 = uVar2 & 0xff;
    if (bVar1) {
      uVar2 = uVar3;
    }
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  dVar6 = BuildLeftPartsDictionary<true>(values,(uint8_t)uVar2,state);
  return dVar6;
}

Assistant:

static double FindBestDictionary(const vector<EXACT_TYPE> &values, State &state) {
		uint8_t right_bit_width = 0;
		double best_dict_size = NumericLimits<int32_t>::Maximum();
		//! Finding the best position to CUT the values
		for (idx_t i = 1; i <= AlpRDConstants::CUTTING_LIMIT; i++) {
			uint8_t candidate_right_bit_width = UnsafeNumericCast<uint8_t>(EXACT_TYPE_BITSIZE - i);
			double estimated_size = BuildLeftPartsDictionary<false>(values, candidate_right_bit_width, state);
			if (estimated_size <= best_dict_size) {
				right_bit_width = candidate_right_bit_width;
				best_dict_size = estimated_size;
			}
			// TODO: We could implement an early exit mechanism similar to normal ALP
		}
		double estimated_size = BuildLeftPartsDictionary<true>(values, right_bit_width, state);
		return estimated_size;
	}